

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefPattern<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTetrahedra>_>::TPZGeoElRefPattern
          (TPZGeoElRefPattern<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTetrahedra>_> *this,
          TPZVec<long> *nodeindices,int matind,TPZGeoMesh *mesh,int64_t *index)

{
  TPZRegisterClassId *in_RDI;
  int64_t *in_stack_00000018;
  TPZGeoMesh *in_stack_00000020;
  int in_stack_0000002c;
  TPZVec<long> *in_stack_00000030;
  void **in_stack_00000038;
  
  TPZRegisterClassId::
  TPZRegisterClassId<TPZGeoElRefPattern<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTetrahedra>>>(in_RDI,0x21)
  ;
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,&PTR_PTR_02453c80);
  TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTetrahedra>_>::TPZGeoElRefLess
            ((TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTetrahedra>_> *)index,
             in_stack_00000038,in_stack_00000030,in_stack_0000002c,in_stack_00000020,
             in_stack_00000018);
  *(undefined ***)in_RDI = &PTR__TPZGeoElRefPattern_02453958;
  *(undefined ***)in_RDI = &PTR__TPZGeoElRefPattern_02453958;
  TPZVec<long>::TPZVec((TPZVec<long> *)(in_RDI + 0x1678));
  TPZAutoPointer<TPZRefPattern>::TPZAutoPointer((TPZAutoPointer<TPZRefPattern> *)in_RDI);
  return;
}

Assistant:

TPZGeoElRefPattern<TGeo>::TPZGeoElRefPattern(TPZVec<int64_t> &nodeindices,int matind,TPZGeoMesh &mesh, int64_t &index) :
TPZRegisterClassId(&TPZGeoElRefPattern<TGeo>::ClassId),TPZGeoElRefLess<TGeo>(nodeindices,matind,mesh,index)
{
}